

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O1

string * __thiscall
spvtools::FriendlyNameMapper::NameForId_abi_cxx11_
          (string *__return_storage_ptr__,FriendlyNameMapper *this,uint32_t id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->name_for_id_)._M_h._M_bucket_count;
  uVar3 = (ulong)id % uVar1;
  p_Var5 = (this->name_for_id_)._M_h._M_buckets[uVar3];
  uVar4 = uVar3;
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != id)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      uVar4 = (ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1;
      p_Var6 = (__node_base_ptr)0x0;
      if ((uVar4 != uVar3) || (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == id))
      goto LAB_0022480d;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0022480d:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    (anonymous_namespace)::to_string_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)id,(uint32_t)uVar4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var2[2]._M_nxt,
               (long)&(p_Var2[2]._M_nxt)->_M_nxt + (long)&(p_Var2[3]._M_nxt)->_M_nxt);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::NameForId(uint32_t id) {
  auto iter = name_for_id_.find(id);
  if (iter == name_for_id_.end()) {
    // It must have been an invalid module, so just return a trivial mapping.
    // We don't care about uniqueness.
    return to_string(id);
  } else {
    return iter->second;
  }
}